

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::deinit
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pTVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar3 + 0x78))(0x8ca9,0);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  pTVar4 = (this->m_textures_info).
           super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_textures_info).
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (**(code **)(lVar3 + 0xb8))(pTVar4[uVar5].m_texture_target,0);
      pTVar4 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar6 < (ulong)((long)(this->m_textures_info).
                                    super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))();
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
  }
  pTVar4 = (this->m_textures_info).
           super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_textures_info).
      super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (**(code **)(lVar3 + 0x480))(1,&pTVar4[uVar5].m_id);
      pTVar4 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar6 < (ulong)((long)(this->m_textures_info).
                                    super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_read_id);
  }
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_draw_id);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredRenderingBoundaryCondition::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, 0);
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
	}

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.deleteTextures(1, &m_textures_info[i].m_id);
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);
	}

	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}